

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableview.cpp
# Opt level: O1

void __thiscall QtMWidgets::TableView::TableView(TableView *this,QWidget *parent)

{
  ScrollAreaPrivate *dd;
  
  *(undefined ***)&(this->super_ScrollArea).super_AbstractScrollArea = &PTR_metaObject_00195848;
  *(undefined ***)&(this->super_ScrollArea).super_AbstractScrollArea.field_0x10 =
       &PTR__TableView_00195a10;
  dd = (ScrollAreaPrivate *)operator_new(0xf0);
  (dd->super_AbstractScrollAreaPrivate).q = (AbstractScrollArea *)this;
  (dd->super_AbstractScrollAreaPrivate).indicatorColor.cspec = Invalid;
  (dd->super_AbstractScrollAreaPrivate).indicatorColor.ct.argb.alpha = 0xffff;
  *(undefined8 *)((long)&(dd->super_AbstractScrollAreaPrivate).indicatorColor.ct + 2) = 0;
  (dd->super_AbstractScrollAreaPrivate).mousePos.xp = 0;
  (dd->super_AbstractScrollAreaPrivate).mousePos.yp = 0;
  (dd->super_AbstractScrollAreaPrivate).viewport = (QWidget *)0x0;
  (dd->super_AbstractScrollAreaPrivate).scrolledAreaSize.wd = 0;
  (dd->super_AbstractScrollAreaPrivate).scrolledAreaSize.ht = 0;
  (dd->super_AbstractScrollAreaPrivate).topLeftCorner.xp = 0;
  (dd->super_AbstractScrollAreaPrivate).topLeftCorner.yp = 0;
  (dd->super_AbstractScrollAreaPrivate).top = 0;
  (dd->super_AbstractScrollAreaPrivate).bottom = 0;
  *(undefined8 *)((long)&(dd->super_AbstractScrollAreaPrivate).top + 1) = 0;
  *(undefined8 *)((long)&(dd->super_AbstractScrollAreaPrivate).right + 1) = 0;
  (dd->super_AbstractScrollAreaPrivate).horIndicator = (ScrollIndicator *)0x0;
  (dd->super_AbstractScrollAreaPrivate).vertIndicator = (ScrollIndicator *)0x0;
  (dd->super_AbstractScrollAreaPrivate).animationTimer = (QTimer *)0x0;
  (dd->super_AbstractScrollAreaPrivate).startBlurAnimTimer = (QTimer *)0x0;
  (dd->super_AbstractScrollAreaPrivate).animationTimeout = 100;
  (dd->super_AbstractScrollAreaPrivate).animationAlphaDelta = 0x19;
  (dd->super_AbstractScrollAreaPrivate).scroller = (Scroller *)0x0;
  (dd->super_AbstractScrollAreaPrivate).horBlur = (BlurEffect *)0x0;
  (dd->super_AbstractScrollAreaPrivate).vertBlur = (BlurEffect *)0x0;
  (dd->super_AbstractScrollAreaPrivate).horBlurAnim = (QVariantAnimation *)0x0;
  (dd->super_AbstractScrollAreaPrivate).vertBlurAnim = (QVariantAnimation *)0x0;
  (dd->super_AbstractScrollAreaPrivate)._vptr_AbstractScrollAreaPrivate =
       (_func_int **)&PTR__ScrollAreaPrivate_001977b0;
  (dd->alignment).i = 0;
  (dd->widget).wp.d = (Data *)0x0;
  (dd->widget).wp.value = (QObject *)0x0;
  dd->resizable = false;
  (dd->super_AbstractScrollAreaPrivate)._vptr_AbstractScrollAreaPrivate =
       (_func_int **)&PTR__TableViewPrivate_00197760;
  *(undefined8 *)((long)&dd[1].super_AbstractScrollAreaPrivate.indicatorColor.ct + 5) = 0;
  *(undefined8 *)((long)&dd[1].super_AbstractScrollAreaPrivate.viewport + 1) = 0;
  *(undefined8 *)&dd[1].super_AbstractScrollAreaPrivate.indicatorColor = 0;
  *(undefined8 *)((long)&dd[1].super_AbstractScrollAreaPrivate.indicatorColor.ct + 4) = 0;
  dd[1].super_AbstractScrollAreaPrivate._vptr_AbstractScrollAreaPrivate = (_func_int **)0x0;
  dd[1].super_AbstractScrollAreaPrivate.q = (AbstractScrollArea *)0x0;
  ScrollArea::ScrollArea(&this->super_ScrollArea,dd,parent);
  *(undefined ***)&(this->super_ScrollArea).super_AbstractScrollArea = &PTR_metaObject_00195848;
  *(undefined ***)&(this->super_ScrollArea).super_AbstractScrollArea.field_0x10 =
       &PTR__TableView_00195a10;
  TableViewPrivate::init
            ((TableViewPrivate *)(this->super_ScrollArea).super_AbstractScrollArea.d.d,
             (EVP_PKEY_CTX *)dd);
  return;
}

Assistant:

TableView::TableView( QWidget * parent )
	:	ScrollArea( new TableViewPrivate( this ), parent )
{
	TableViewPrivate * d = d_func();
	d->init();
}